

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_StrCaseEq_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_StrCaseEq_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *p;
  char **in_R9;
  AssertionResult iutest_ar;
  char test [5];
  allocator<char> local_211;
  AssertionResult local_210;
  AssertionHelper local_1e8;
  char local_1b8 [8];
  undefined1 local_1b0 [392];
  
  builtin_strncpy(local_1b8,"Test",5);
  local_1b0._0_8_ = "test";
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b8;
  iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
            (&local_210,(StrCaseEqHelper *)0x33ddeb,"test",local_1b0,(char **)&local_1e8,in_R9);
  bVar2 = local_210.m_result;
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b0,(char **)&local_1e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,&local_211);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x17d;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    local_1b0._0_8_ = "test";
    local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b8;
    iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
              (&local_210,(StrCaseEqHelper *)0x33ddeb,"test",local_1b0,(char **)&local_1e8,in_R9);
    if (local_210.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b0,(char **)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,&local_211);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x17f;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    paVar1 = &local_210.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_210.m_message._M_dataplus._M_p,
                      local_210.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1b0._0_8_ = "test";
    local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b8;
    iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
              (&local_210,(StrCaseEqHelper *)0x33ddeb,"test",local_1b0,(char **)&local_1e8,in_R9);
    if (local_210.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b0,(char **)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,&local_211);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x181;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_210.m_message._M_dataplus._M_p,
                      local_210.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1b0._0_8_ = "test";
    local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b8;
    iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
              (&local_210,(StrCaseEqHelper *)0x33ddeb,"test",local_1b0,(char **)&local_1e8,in_R9);
    if (local_210.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b0,(char **)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,&local_211);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x183;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_210.m_message._M_dataplus._M_p,
                      local_210.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

TEST(GTestSyntaxTest, StrCaseEq)
{
    const char test[] = "Test";
    if( const char* p = "test" )
        ASSERT_STRCASEEQ(p, test) << p;
    if( const char* p = "test" )
        EXPECT_STRCASEEQ(p, test) << p;
    if( const char* p = "test" )
        INFORM_STRCASEEQ(p, test) << p;
    if( const char* p = "test" )
        ASSUME_STRCASEEQ(p, test) << p;
}